

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O2

opj_bool jp2_read_colr_v2(opj_jp2_v2_t *jp2,uchar *p_colr_header_data,OPJ_UINT32 p_colr_header_size,
                         opj_event_mgr_t *p_manager)

{
  undefined8 in_RAX;
  uchar *puVar1;
  char *fmt;
  opj_bool oVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  undefined8 uStack_38;
  OPJ_UINT32 l_value;
  
  if (p_colr_header_size < 3) {
    fmt = "Bad COLR header box (bad size)\n";
LAB_001e6711:
    oVar2 = 0;
    opj_event_msg_v2(p_manager,1,fmt);
  }
  else {
    if ((jp2->color).jp2_has_colr == '\0') {
      uStack_38 = in_RAX;
      opj_read_bytes_LE(p_colr_header_data,&jp2->meth,1);
      opj_read_bytes_LE(p_colr_header_data + 1,&jp2->precedence,1);
      opj_read_bytes_LE(p_colr_header_data + 2,&jp2->approx,1);
      if (jp2->meth == 2) {
        uVar4 = p_colr_header_size - 3;
        (jp2->color).icc_profile_len = uVar4;
        puVar1 = (uchar *)calloc(1,(long)(int)uVar4);
        (jp2->color).icc_profile_buf = puVar1;
        uVar3 = 0;
        uVar5 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar5 = uVar3;
        }
        for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
          opj_read_bytes_LE(p_colr_header_data + 3 + uVar3,&l_value,1);
          (jp2->color).icc_profile_buf[uVar3] = (uchar)l_value;
        }
      }
      else if (jp2->meth == 1) {
        if (p_colr_header_size != 7) {
          fmt = "Bad BPCC header box (bad size)\n";
          goto LAB_001e6711;
        }
        opj_read_bytes_LE(p_colr_header_data + 3,&jp2->enumcs,4);
      }
      else {
        opj_event_msg_v2(p_manager,4,
                         "COLR BOX meth value is not a regular value (%d), so we will skip the fields following the approx field.\n"
                        );
      }
      (jp2->color).jp2_has_colr = '\x01';
    }
    else {
      opj_event_msg_v2(p_manager,4,
                       "A conforming JP2 reader shall ignore all Colour Specification boxes after the first, so we ignore this one.\n"
                      );
    }
    oVar2 = 1;
  }
  return oVar2;
}

Assistant:

static opj_bool jp2_read_colr_v2(	opj_jp2_v2_t * jp2,
							unsigned char * p_colr_header_data,
							OPJ_UINT32 p_colr_header_size,
							opj_event_mgr_t * p_manager
						  )
{
	OPJ_UINT32 l_value;

	/* preconditions */
	assert(jp2 != 00);
	assert(p_colr_header_data != 00);
	assert(p_manager != 00);

	if (p_colr_header_size < 3) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Bad COLR header box (bad size)\n");
		return OPJ_FALSE;
	}

	/* Part 1, I.5.3.3 : 'A conforming JP2 reader shall ignore all Colour
	 * Specification boxes after the first.'
	*/
	if(jp2->color.jp2_has_colr) {
		opj_event_msg_v2(p_manager, EVT_INFO, "A conforming JP2 reader shall ignore all Colour Specification boxes after the first, so we ignore this one.\n");
		p_colr_header_data += p_colr_header_size;
		return OPJ_TRUE;
	}

	opj_read_bytes(p_colr_header_data,&jp2->meth ,1);			/* METH */
	++p_colr_header_data;

	opj_read_bytes(p_colr_header_data,&jp2->precedence ,1);		/* PRECEDENCE */
	++p_colr_header_data;

	opj_read_bytes(p_colr_header_data,&jp2->approx ,1);			/* APPROX */
	++p_colr_header_data;

	if (jp2->meth == 1) {
		if (p_colr_header_size != 7) {
			opj_event_msg_v2(p_manager, EVT_ERROR, "Bad BPCC header box (bad size)\n");
			return OPJ_FALSE;
		}

		opj_read_bytes(p_colr_header_data,&jp2->enumcs ,4);			/* EnumCS */
	}
	else if (jp2->meth == 2) {
		/* ICC profile */
		int it_icc_value = 0;
		int icc_len = p_colr_header_size - 3;

		jp2->color.icc_profile_len = icc_len;
		jp2->color.icc_profile_buf = (unsigned char*) opj_malloc(icc_len);

		memset(jp2->color.icc_profile_buf, 0, icc_len * sizeof(unsigned char));

		for (it_icc_value = 0; it_icc_value < icc_len; ++it_icc_value)
		{
			opj_read_bytes(p_colr_header_data,&l_value,1);		/* icc values */
			++p_colr_header_data;
			jp2->color.icc_profile_buf[it_icc_value] = (OPJ_BYTE) l_value;
		}

	}
	else /* TODO MSD */
		opj_event_msg_v2(p_manager, EVT_INFO, "COLR BOX meth value is not a regular value (%d), so we will skip the fields following the approx field.\n", jp2->meth);

	jp2->color.jp2_has_colr = 1;

	return OPJ_TRUE;
}